

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O0

void __thiscall NaPNStatistics::print_stat(NaPNStatistics *this,char *szTitle,FILE *fp)

{
  NaReal NVar1;
  NaReal NVar2;
  NaReal NVar3;
  double dVar4;
  NaReal NVar5;
  NaReal NVar6;
  uint uVar7;
  char *pcVar8;
  NaReal *pNVar9;
  FILE *in_RDX;
  long in_RSI;
  NaPetriNode *in_RDI;
  double dVar10;
  uint i;
  uint in_stack_ffffffffffffff4c;
  NaVector *in_stack_ffffffffffffff50;
  uint local_1c;
  
  if (in_RSI == 0) {
    if (in_RDX == (FILE *)0x0) {
      pcVar8 = NaPetriNode::name(in_RDI);
      NaPrintLog("Statistics of node \'%s\':\n",pcVar8);
    }
    else {
      pcVar8 = NaPetriNode::name(in_RDI);
      fprintf(in_RDX,"Statistics of node \'%s\':\n",pcVar8);
    }
  }
  else if (in_RDX == (FILE *)0x0) {
    NaPrintLog("%s\n",in_RSI);
  }
  else {
    fprintf(in_RDX,"%s\n",in_RSI);
  }
  if (in_RDX == (FILE *)0x0) {
    NaPrintLog("       Min        Max         Mean     StdDev Dispersion        RMS Volume\n");
  }
  else {
    fprintf(in_RDX,"       Min        Max         Mean     StdDev Dispersion        RMS Volume\n");
  }
  for (local_1c = 0; uVar7 = NaVector::dim((NaVector *)&in_RDI[3].bHalt), local_1c < uVar7;
      local_1c = local_1c + 1) {
    if (in_RDX == (FILE *)0x0) {
      pNVar9 = NaVector::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      pcVar8 = (char *)*pNVar9;
      pNVar9 = NaVector::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      NVar1 = *pNVar9;
      pNVar9 = NaVector::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      NVar2 = *pNVar9;
      pNVar9 = NaVector::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      NVar3 = *pNVar9;
      pNVar9 = NaVector::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      dVar10 = *pNVar9;
      pNVar9 = NaVector::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      dVar4 = *pNVar9;
      pNVar9 = NaVector::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      NVar5 = *pNVar9;
      uVar7 = NaPetriNode::activations(in_RDI);
      NaPrintLog(pcVar8,NVar1,NVar2,NVar3,dVar10 * dVar4,NVar5,"%10g %10g %12g %10g %10g %10g %u\n",
                 (ulong)uVar7);
    }
    else {
      pNVar9 = NaVector::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      NVar1 = *pNVar9;
      pNVar9 = NaVector::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      NVar2 = *pNVar9;
      pNVar9 = NaVector::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      NVar3 = *pNVar9;
      pNVar9 = NaVector::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      NVar5 = *pNVar9;
      pNVar9 = NaVector::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      in_stack_ffffffffffffff50 = (NaVector *)*pNVar9;
      pNVar9 = NaVector::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      dVar10 = (double)in_stack_ffffffffffffff50 * *pNVar9;
      pNVar9 = NaVector::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      NVar6 = *pNVar9;
      uVar7 = NaPetriNode::activations(in_RDI);
      fprintf(in_RDX,"%10g %10g %12g %10g %10g %10g %u\n",NVar1,NVar2,NVar3,NVar5,dVar10,NVar6,
              (ulong)uVar7);
    }
  }
  return;
}

Assistant:

void
NaPNStatistics::print_stat (const char* szTitle, FILE* fp)
{
    if(NULL == szTitle){
      if(NULL == fp)
        NaPrintLog("Statistics of node '%s':\n", name());
      else
        fprintf(fp, "Statistics of node '%s':\n", name());
    }else{
      if(NULL == fp)
        NaPrintLog("%s\n", szTitle);
      else
	fprintf(fp ,"%s\n", szTitle);
    }
    if(NULL == fp)
      NaPrintLog("       Min        Max         Mean     StdDev "	\
		 "Dispersion        RMS Volume\n");
    else
      fprintf(fp, "       Min        Max         Mean     StdDev "	\
	      "Dispersion        RMS Volume\n");
    for(unsigned i = 0; i < Mean.dim(); ++i){
      if(NULL == fp)
	NaPrintLog("%10g %10g %12g %10g %10g %10g %u\n",
		   Min[i], Max[i], Mean[i], StdDev[i], StdDev[i]*StdDev[i],
		   RMS[i], activations());
      else
	fprintf(fp, "%10g %10g %12g %10g %10g %10g %u\n",
		Min[i], Max[i], Mean[i], StdDev[i], StdDev[i]*StdDev[i],
		RMS[i], activations());
    }
}